

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

UnifiedVectorFormat * __thiscall
duckdb::UnifiedVectorFormat::operator=(UnifiedVectorFormat *this,UnifiedVectorFormat *other)

{
  SelectionVector *pSVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  
  pSVar1 = other->sel;
  pSVar2 = this->sel;
  this->sel = pSVar1;
  other->sel = pSVar2;
  pdVar3 = this->data;
  this->data = other->data;
  other->data = pdVar3;
  ::std::swap<duckdb::ValidityMask>(&this->validity,&other->validity);
  ::std::swap<duckdb::SelectionVector>(&this->owned_sel,&other->owned_sel);
  if (pSVar1 == &other->owned_sel) {
    this->sel = &this->owned_sel;
  }
  return this;
}

Assistant:

UnifiedVectorFormat &UnifiedVectorFormat::operator=(UnifiedVectorFormat &&other) noexcept {
	bool refers_to_self = other.sel == &other.owned_sel;
	std::swap(sel, other.sel);
	std::swap(data, other.data);
	std::swap(validity, other.validity);
	std::swap(owned_sel, other.owned_sel);
	if (refers_to_self) {
		sel = &owned_sel;
	}
	return *this;
}